

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O0

bool __thiscall
burst::subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::equal(subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
        *this,subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              *that)

{
  bool bVar1;
  const_iterator __first1;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  __last1;
  const_iterator __first2;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  __last2;
  subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  *that_local;
  subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  *this_local;
  
  if (this->m_begin != that->m_begin) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                  ,0x83,
                  "bool burst::subsequence_iterator<const char *>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = const char *, SubsequenceContainer = std::vector<const char *>]"
                 );
  }
  if (this->m_end == that->m_end) {
    __first1 = subsequence_begin(this);
    __last1 = subsequence_end(this);
    __first2 = subsequence_begin(that);
    __last2 = subsequence_end(that);
    bVar1 = std::
            equal<__gnu_cxx::__normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>>
                      ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        )__first1._M_current,__last1,
                       (__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        )__first2._M_current,__last2);
    return bVar1;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                ,0x84,
                "bool burst::subsequence_iterator<const char *>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = const char *, SubsequenceContainer = std::vector<const char *>]"
               );
}

Assistant:

bool equal (const subsequence_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subsequence_begin(), this->subsequence_end(),
                    that.subsequence_begin(), that.subsequence_end()
                );
        }